

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  size_t sVar6;
  lconv *plVar7;
  LuaType LVar8;
  int iVar9;
  int mode;
  int mode_00;
  Value VVar10;
  char cVar11;
  int iVar12;
  ulong uVar13;
  lua_Number n;
  Value local_100;
  char local_f8 [216];
  
  pbVar4 = (byte *)s;
  do {
    pbVar3 = pbVar4;
    bVar1 = *pbVar3;
    uVar13 = (ulong)bVar1;
    pbVar4 = pbVar3 + 1;
  } while ((""[uVar13 + 1] & 8) != 0);
  if (bVar1 == 0x2b) {
    iVar9 = 0;
LAB_001331fe:
    uVar13 = (ulong)*pbVar4;
  }
  else {
    iVar9 = 1;
    if (bVar1 == 0x2d) goto LAB_001331fe;
    iVar9 = 0;
    pbVar4 = pbVar3;
  }
  if (((char)uVar13 == '0') && ((pbVar4[1] | 0x20) == 0x78)) {
    uVar13 = (ulong)pbVar4[2];
    pbVar4 = pbVar4 + 2;
    if ((""[uVar13 + 1] & 0x10) == 0) goto LAB_00133267;
    VVar10.gc = (GCObject *)0x0;
    do {
      cVar11 = (char)uVar13;
      uVar13 = (ulong)pbVar4[1];
      iVar12 = ((int)cVar11 | 0x20U) - 0x57;
      if ((""[(long)cVar11 + 1] & 2) != 0) {
        iVar12 = (int)cVar11 - 0x30;
      }
      pbVar4 = pbVar4 + 1;
      VVar10.gc = (GCObject *)((long)iVar12 + VVar10.i * 0x10);
    } while ((""[uVar13 + 1] & 0x10) != 0);
LAB_001332b0:
    bVar2 = true;
  }
  else {
    if ((""[uVar13 + 1] & 2) != 0) {
      VVar10.gc = (GCObject *)0x0;
      do {
        iVar12 = (char)uVar13 + -0x30;
        if (((GCObject *)0xccccccccccccccb < VVar10.gc) &&
           ((VVar10.gc != (GCObject *)0xccccccccccccccc || (iVar9 + 7 < iVar12))))
        goto LAB_001332e7;
        VVar10.gc = (GCObject *)((long)iVar12 + VVar10.i * 10);
        uVar13 = (ulong)pbVar4[1];
        pbVar4 = pbVar4 + 1;
      } while ((""[uVar13 + 1] & 2) != 0);
      goto LAB_001332b0;
    }
LAB_00133267:
    bVar2 = false;
    VVar10.gc = (GCObject *)0x0;
  }
  pbVar4 = pbVar4 + -1;
  do {
    pbVar3 = pbVar4 + 1;
    pbVar4 = pbVar4 + 1;
  } while ((""[(ulong)*pbVar3 + 1] & 8) != 0);
  if (bVar2 && *pbVar3 == 0) {
    LVar8 = 0x13;
    local_100.i = -VVar10.i;
    if (iVar9 == 0) {
      local_100 = VVar10;
    }
LAB_00133322:
    o->value_ = local_100;
    o->tt_ = LVar8;
    pbVar4 = pbVar4 + (1 - (long)s);
  }
  else {
LAB_001332e7:
    pbVar4 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar4 == (byte *)0x0) || ((*pbVar4 & 0xdf) != 0x4e)) {
      pbVar4 = (byte *)l_str2dloc(s,&local_100.n,mode);
      if (pbVar4 != (byte *)0x0) {
LAB_00133319:
        LVar8 = 3;
        goto LAB_00133322;
      }
      pcVar5 = strchr(s,0x2e);
      sVar6 = strlen(s);
      if (pcVar5 != (char *)0x0 && sVar6 < 0xc9) {
        strcpy(local_f8,s);
        plVar7 = localeconv();
        pcVar5[(long)(local_f8 + -(long)s)] = *plVar7->decimal_point;
        pcVar5 = l_str2dloc(local_f8,&local_100.n,mode_00);
        if ((pcVar5 != (char *)0x0) && (s != (char *)0x0)) {
          pbVar4 = (byte *)(s + ((long)pcVar5 - (long)local_f8));
          goto LAB_00133319;
        }
      }
    }
    pbVar4 = (byte *)0x0;
  }
  return (size_t)pbVar4;
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return (e - s) + 1;  /* success; return string size */
}